

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_BoxArray.cpp
# Opt level: O1

Long __thiscall amrex::BoxArray::numPts(BoxArray *this)

{
  long *plVar1;
  undefined8 uVar2;
  element_type *peVar3;
  long lVar4;
  long lVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  int dir_1;
  uint uVar9;
  int iVar10;
  long lVar11;
  long lVar12;
  Long LVar13;
  uint uVar14;
  long lVar15;
  uint uVar16;
  ulong uVar17;
  IntVect IVar18;
  Box result;
  Box bx;
  undefined8 local_88;
  uint uStack_80;
  uint auStack_7c [2];
  undefined8 uStack_74;
  Box local_68;
  int local_40 [3];
  
  peVar3 = (this->m_ref).super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  lVar11 = *(long *)&(peVar3->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                     super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                     super__Vector_impl_data;
  uVar16 = (int)((long)*(pointer *)
                        ((long)&(peVar3->m_abox).
                                super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                                super__Vector_impl_data + 8) - lVar11 >> 2) * -0x49249249;
  switch((this->m_bat).m_bat_type) {
  case null:
    if (0 < (int)uVar16) {
      lVar15 = 0;
      lVar12 = 0;
      do {
        uVar2 = *(undefined8 *)(lVar11 + 0xc + lVar15);
        lVar12 = lVar12 + (long)((*(int *)(lVar11 + 0x14 + lVar15) - *(int *)(lVar11 + 8 + lVar15))
                                + 1) *
                          (long)(((int)uVar2 - (int)*(undefined8 *)(lVar11 + lVar15)) + 1) *
                          (long)(((int)((ulong)uVar2 >> 0x20) -
                                 (int)((ulong)*(undefined8 *)(lVar11 + lVar15) >> 0x20)) + 1);
        lVar15 = lVar15 + 0x1c;
      } while ((ulong)(uVar16 & 0x7fffffff) * 0x1c != lVar15);
      return lVar12;
    }
    goto LAB_004808a9;
  case indexType:
  case indexType_coarsenRatio:
    uVar14 = *(uint *)&(this->m_bat).m_op;
    break;
  case coarsenRatio:
    uVar14 = 0;
    break;
  case bndryReg:
    if (0 < (int)uVar16) {
      uVar17 = (ulong)(uVar16 & 0x7fffffff);
      lVar15 = 0;
      lVar11 = 0;
      do {
        BATbndryReg::operator()
                  (&local_68,&(this->m_bat).m_op.m_bndryReg,
                   (Box *)(*(long *)&(peVar3->m_abox).
                                     super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                     super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                                     _M_impl.super__Vector_impl_data + lVar15));
        lVar11 = lVar11 + (long)((local_68.bigend.vect[2] - local_68.smallend.vect[2]) + 1) *
                          (long)((local_68.bigend.vect[0] - local_68.smallend.vect[0]) + 1) *
                          (long)((local_68.bigend.vect[1] - local_68.smallend.vect[1]) + 1);
        lVar15 = lVar15 + 0x1c;
        uVar17 = uVar17 - 1;
      } while (uVar17 != 0);
      return lVar11;
    }
    goto LAB_004808a9;
  default:
    uVar14 = *(uint *)((long)&(this->m_bat).m_op + 4);
  }
  IVar18 = BATransformer::coarsen_ratio(&this->m_bat);
  iVar10 = IVar18.vect[2];
  local_40[0] = IVar18.vect[0];
  local_40[1] = IVar18.vect[1];
  local_40[2] = IVar18.vect[2];
  if ((int)uVar16 < 1) {
LAB_004808a9:
    LVar13 = 0;
  }
  else {
    lVar11 = *(long *)&(peVar3->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                       super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                       super__Vector_impl_data;
    local_40[0] = IVar18.vect[0];
    local_40[1] = IVar18.vect[1];
    uVar17 = 0;
    LVar13 = 0;
    do {
      plVar1 = (long *)(lVar11 + uVar17 * 0x1c);
      lVar15 = *plVar1;
      lVar12 = plVar1[1];
      plVar1 = (long *)(lVar11 + 0xc + uVar17 * 0x1c);
      lVar4 = *plVar1;
      lVar5 = plVar1[1];
      auStack_7c[1] = (uint)((ulong)lVar4 >> 0x20);
      uStack_74 = lVar5;
      uStack_80 = (uint)lVar12;
      auStack_7c[0] = (uint)((ulong)lVar12 >> 0x20);
      local_88 = lVar15;
      if (iVar10 != 1 || (local_40[1] != 1 || local_40[0] != 1)) {
        local_88._0_4_ = (uint)lVar15;
        if (local_40[0] != 1) {
          if (local_40[0] == 4) {
            if ((int)(uint)local_88 < 0) {
              local_88._0_4_ = (uint)local_88 + 1;
              uVar8 = -(uint)local_88;
              if (0 < (int)(uint)local_88) {
                uVar8 = (uint)local_88;
              }
              uVar8 = uVar8 >> 2;
LAB_00480428:
              local_88._0_4_ = ~uVar8;
            }
            else {
              local_88._0_4_ = (uint)local_88 >> 2;
            }
          }
          else if (local_40[0] == 2) {
            if ((int)(uint)local_88 < 0) {
              local_88._0_4_ = (uint)local_88 + 1;
              uVar8 = -(uint)local_88;
              if (0 < (int)(uint)local_88) {
                uVar8 = (uint)local_88;
              }
              uVar8 = uVar8 >> 1;
              goto LAB_00480428;
            }
            local_88._0_4_ = (uint)local_88 >> 1;
          }
          else if ((int)(uint)local_88 < 0) {
            iVar7 = (uint)local_88 + 1;
            iVar6 = -iVar7;
            if (0 < iVar7) {
              iVar6 = iVar7;
            }
            local_88._0_4_ = ~(iVar6 / local_40[0]);
          }
          else {
            local_88._0_4_ = (int)(uint)local_88 / local_40[0];
          }
        }
        local_88._4_4_ = (uint)((ulong)lVar15 >> 0x20);
        if (local_40[1] != 1) {
          if (local_40[1] == 4) {
            if (lVar15 < 0) {
              local_88._4_4_ = local_88._4_4_ + 1;
              uVar8 = -local_88._4_4_;
              if (0 < (int)local_88._4_4_) {
                uVar8 = local_88._4_4_;
              }
              uVar8 = uVar8 >> 2;
LAB_0048048c:
              local_88._4_4_ = ~uVar8;
            }
            else {
              local_88._4_4_ = local_88._4_4_ >> 2;
            }
          }
          else if (local_40[1] == 2) {
            if (lVar15 < 0) {
              local_88._4_4_ = local_88._4_4_ + 1;
              uVar8 = -local_88._4_4_;
              if (0 < (int)local_88._4_4_) {
                uVar8 = local_88._4_4_;
              }
              uVar8 = uVar8 >> 1;
              goto LAB_0048048c;
            }
            local_88._4_4_ = local_88._4_4_ >> 1;
          }
          else if (lVar15 < 0) {
            iVar7 = local_88._4_4_ + 1;
            iVar6 = -iVar7;
            if (0 < iVar7) {
              iVar6 = iVar7;
            }
            local_88._4_4_ = ~(iVar6 / local_40[1]);
          }
          else {
            local_88._4_4_ = (int)local_88._4_4_ / local_40[1];
          }
        }
        if (iVar10 != 1) {
          if (iVar10 == 4) {
            if ((int)uStack_80 < 0) {
              uStack_80 = uStack_80 + 1;
              uVar8 = -uStack_80;
              if (0 < (int)uStack_80) {
                uVar8 = uStack_80;
              }
              uVar8 = uVar8 >> 2;
LAB_004804ed:
              uStack_80 = ~uVar8;
            }
            else {
              uStack_80 = uStack_80 >> 2;
            }
          }
          else if (iVar10 == 2) {
            if ((int)uStack_80 < 0) {
              uStack_80 = uStack_80 + 1;
              uVar8 = -uStack_80;
              if (0 < (int)uStack_80) {
                uVar8 = uStack_80;
              }
              uVar8 = uVar8 >> 1;
              goto LAB_004804ed;
            }
            uStack_80 = uStack_80 >> 1;
          }
          else if ((int)uStack_80 < 0) {
            iVar7 = uStack_80 + 1;
            iVar6 = -iVar7;
            if (0 < iVar7) {
              iVar6 = iVar7;
            }
            uStack_80 = ~(iVar6 / iVar10);
          }
          else {
            uStack_80 = (int)uStack_80 / iVar10;
          }
        }
        uStack_74._4_4_ = (uint)((ulong)lVar5 >> 0x20);
        uStack_74._0_4_ = (uint)lVar5;
        if (uStack_74._4_4_ == 0) {
          if (local_40[0] != 1) {
            if (local_40[0] == 4) {
              if (lVar12 < 0) {
                auStack_7c[0] = auStack_7c[0] + 1;
                uVar8 = -auStack_7c[0];
                if (0 < (int)auStack_7c[0]) {
                  uVar8 = auStack_7c[0];
                }
                uVar8 = uVar8 >> 2;
LAB_004807b8:
                auStack_7c[0] = ~uVar8;
              }
              else {
                auStack_7c[0] = auStack_7c[0] >> 2;
              }
            }
            else if (local_40[0] == 2) {
              if (lVar12 < 0) {
                auStack_7c[0] = auStack_7c[0] + 1;
                uVar8 = -auStack_7c[0];
                if (0 < (int)auStack_7c[0]) {
                  uVar8 = auStack_7c[0];
                }
                uVar8 = uVar8 >> 1;
                goto LAB_004807b8;
              }
              auStack_7c[0] = auStack_7c[0] >> 1;
            }
            else if (lVar12 < 0) {
              iVar7 = auStack_7c[0] + 1;
              iVar6 = -iVar7;
              if (0 < iVar7) {
                iVar6 = iVar7;
              }
              auStack_7c[0] = ~(iVar6 / local_40[0]);
            }
            else {
              auStack_7c[0] = (int)auStack_7c[0] / local_40[0];
            }
          }
          if (local_40[1] != 1) {
            if (local_40[1] == 4) {
              if (lVar4 < 0) {
                auStack_7c[1] = auStack_7c[1] + 1;
                uVar8 = -auStack_7c[1];
                if (0 < (int)auStack_7c[1]) {
                  uVar8 = auStack_7c[1];
                }
                uVar8 = uVar8 >> 2;
LAB_0048081d:
                auStack_7c[1] = ~uVar8;
              }
              else {
                auStack_7c[1] = auStack_7c[1] >> 2;
              }
            }
            else if (local_40[1] == 2) {
              if (lVar4 < 0) {
                auStack_7c[1] = auStack_7c[1] + 1;
                uVar8 = -auStack_7c[1];
                if (0 < (int)auStack_7c[1]) {
                  uVar8 = auStack_7c[1];
                }
                uVar8 = uVar8 >> 1;
                goto LAB_0048081d;
              }
              auStack_7c[1] = auStack_7c[1] >> 1;
            }
            else if (lVar4 < 0) {
              iVar7 = auStack_7c[1] + 1;
              iVar6 = -iVar7;
              if (0 < iVar7) {
                iVar6 = iVar7;
              }
              auStack_7c[1] = ~(iVar6 / local_40[1]);
            }
            else {
              auStack_7c[1] = (int)auStack_7c[1] / local_40[1];
            }
          }
          if (iVar10 != 1) {
            if (iVar10 == 4) {
              if ((int)(uint)uStack_74 < 0) {
                uStack_74._0_4_ = (uint)uStack_74 + 1;
                uVar8 = -(uint)uStack_74;
                if (0 < (int)(uint)uStack_74) {
                  uVar8 = (uint)uStack_74;
                }
                uVar8 = uVar8 >> 2;
LAB_0048088b:
                uStack_74._0_4_ = ~uVar8;
              }
              else {
                uStack_74._0_4_ = (uint)uStack_74 >> 2;
              }
            }
            else if (iVar10 == 2) {
              if ((int)(uint)uStack_74 < 0) {
                uStack_74._0_4_ = (uint)uStack_74 + 1;
                uVar8 = -(uint)uStack_74;
                if (0 < (int)(uint)uStack_74) {
                  uVar8 = (uint)uStack_74;
                }
                uVar8 = uVar8 >> 1;
                goto LAB_0048088b;
              }
              uStack_74._0_4_ = (uint)uStack_74 >> 1;
            }
            else if ((int)(uint)uStack_74 < 0) {
              iVar7 = (uint)uStack_74 + 1;
              iVar6 = -iVar7;
              if (0 < iVar7) {
                iVar6 = iVar7;
              }
              uStack_74._0_4_ = ~(iVar6 / iVar10);
            }
            else {
              uStack_74._0_4_ = (int)(uint)uStack_74 / iVar10;
            }
          }
        }
        else {
          local_68.smallend.vect[0] = 0;
          local_68.smallend.vect[1] = 0;
          local_68.smallend.vect[2] = 0;
          lVar15 = 0;
          do {
            if (((uStack_74._4_4_ >> ((uint)lVar15 & 0x1f) & 1) != 0) &&
               ((int)auStack_7c[lVar15] % local_40[lVar15] != 0)) {
              local_68.smallend.vect[lVar15] = 1;
            }
            lVar15 = lVar15 + 1;
          } while (lVar15 != 3);
          if (local_40[0] != 1) {
            if (local_40[0] == 4) {
              if (lVar12 < 0) {
                auStack_7c[0] = auStack_7c[0] + 1;
                uVar8 = -auStack_7c[0];
                if (0 < (int)auStack_7c[0]) {
                  uVar8 = auStack_7c[0];
                }
                uVar8 = uVar8 >> 2;
LAB_004805e2:
                auStack_7c[0] = ~uVar8;
              }
              else {
                auStack_7c[0] = auStack_7c[0] >> 2;
              }
            }
            else if (local_40[0] == 2) {
              if (lVar12 < 0) {
                auStack_7c[0] = auStack_7c[0] + 1;
                uVar8 = -auStack_7c[0];
                if (0 < (int)auStack_7c[0]) {
                  uVar8 = auStack_7c[0];
                }
                uVar8 = uVar8 >> 1;
                goto LAB_004805e2;
              }
              auStack_7c[0] = auStack_7c[0] >> 1;
            }
            else if (lVar12 < 0) {
              iVar7 = auStack_7c[0] + 1;
              iVar6 = -iVar7;
              if (0 < iVar7) {
                iVar6 = iVar7;
              }
              auStack_7c[0] = ~(iVar6 / local_40[0]);
            }
            else {
              auStack_7c[0] = (int)auStack_7c[0] / local_40[0];
            }
          }
          if (local_40[1] != 1) {
            if (local_40[1] == 4) {
              if (lVar4 < 0) {
                auStack_7c[1] = auStack_7c[1] + 1;
                uVar8 = -auStack_7c[1];
                if (0 < (int)auStack_7c[1]) {
                  uVar8 = auStack_7c[1];
                }
                uVar8 = uVar8 >> 2;
LAB_00480649:
                auStack_7c[1] = ~uVar8;
              }
              else {
                auStack_7c[1] = auStack_7c[1] >> 2;
              }
            }
            else if (local_40[1] == 2) {
              if (lVar4 < 0) {
                auStack_7c[1] = auStack_7c[1] + 1;
                uVar8 = -auStack_7c[1];
                if (0 < (int)auStack_7c[1]) {
                  uVar8 = auStack_7c[1];
                }
                uVar8 = uVar8 >> 1;
                goto LAB_00480649;
              }
              auStack_7c[1] = auStack_7c[1] >> 1;
            }
            else if (lVar4 < 0) {
              iVar7 = auStack_7c[1] + 1;
              iVar6 = -iVar7;
              if (0 < iVar7) {
                iVar6 = iVar7;
              }
              auStack_7c[1] = ~(iVar6 / local_40[1]);
            }
            else {
              auStack_7c[1] = (int)auStack_7c[1] / local_40[1];
            }
          }
          if (iVar10 != 1) {
            if (iVar10 == 4) {
              if ((int)(uint)uStack_74 < 0) {
                uStack_74._0_4_ = (uint)uStack_74 + 1;
                uVar8 = -(uint)uStack_74;
                if (0 < (int)(uint)uStack_74) {
                  uVar8 = (uint)uStack_74;
                }
                uVar8 = uVar8 >> 2;
LAB_004806aa:
                uStack_74._0_4_ = ~uVar8;
              }
              else {
                uStack_74._0_4_ = (uint)uStack_74 >> 2;
              }
            }
            else if (iVar10 == 2) {
              if ((int)(uint)uStack_74 < 0) {
                uStack_74._0_4_ = (uint)uStack_74 + 1;
                uVar8 = -(uint)uStack_74;
                if (0 < (int)(uint)uStack_74) {
                  uVar8 = (uint)uStack_74;
                }
                uVar8 = uVar8 >> 1;
                goto LAB_004806aa;
              }
              uStack_74._0_4_ = (uint)uStack_74 >> 1;
            }
            else if ((int)(uint)uStack_74 < 0) {
              iVar7 = (uint)uStack_74 + 1;
              iVar6 = -iVar7;
              if (0 < iVar7) {
                iVar6 = iVar7;
              }
              uStack_74._0_4_ = ~(iVar6 / iVar10);
            }
            else {
              uStack_74._0_4_ = (int)(uint)uStack_74 / iVar10;
            }
          }
          auStack_7c[0] = auStack_7c[0] + local_68.smallend.vect[0];
          auStack_7c[1] = auStack_7c[1] + local_68.smallend.vect[1];
          uStack_74._0_4_ = (uint)uStack_74 + local_68.smallend.vect[2];
        }
      }
      local_68.bigend.vect[1] = auStack_7c[1];
      local_68.bigend.vect[2] = (uint)uStack_74;
      local_68.btype.itype = uStack_74._4_4_;
      local_68.bigend.vect[0] = auStack_7c[0];
      lVar15 = 0;
      do {
        uVar8 = 1 << ((byte)lVar15 & 0x1f);
        uVar9 = (uint)lVar15;
        local_68.bigend.vect[lVar15] =
             (local_68.bigend.vect[lVar15] + (uint)((uVar14 >> (uVar9 & 0x1f) & 1) != 0)) -
             (uint)((local_68.btype.itype >> (uVar9 & 0x1f) & 1) != 0);
        if ((uVar14 >> (uVar9 & 0x1f) & 1) == 0) {
          local_68.btype.itype = ~uVar8 & local_68.btype.itype;
        }
        else {
          local_68.btype.itype = uVar8 | local_68.btype.itype;
        }
        lVar15 = lVar15 + 1;
      } while (lVar15 != 3);
      LVar13 = LVar13 + (long)(int)((local_68.bigend.vect[2] - uStack_80) + 1) *
                        (long)((local_68.bigend.vect[0] - (int)local_88) + 1) *
                        (long)((local_68.bigend.vect[1] - (int)((ulong)local_88 >> 0x20)) + 1);
      uVar17 = uVar17 + 1;
    } while (uVar17 != (uVar16 & 0x7fffffff));
  }
  return LVar13;
}

Assistant:

Long
BoxArray::numPts () const noexcept
{
    Long result = 0;
    const int N = size();
    auto const& bxs = this->m_ref->m_abox;
    if (m_bat.is_null()) {
#ifdef AMREX_USE_OMP
#pragma omp parallel for reduction(+:result)
#endif
        for (int i = 0; i < N; ++i)
        {
            result += bxs[i].numPts();
        }
    } else if (m_bat.is_simple()) {
        IndexType t = ixType();
        IntVect cr = crseRatio();
#ifdef AMREX_USE_OMP
#pragma omp parallel for reduction(+:result)
#endif
        for (int i = 0; i < N; ++i)
        {
            result += amrex::convert(amrex::coarsen(bxs[i],cr),t).numPts();
        }
    } else {
#ifdef AMREX_USE_OMP
#pragma omp parallel for reduction(+:result)
#endif
        for (int i = 0; i < N; ++i)
        {
            result += m_bat.m_op.m_bndryReg(bxs[i]).numPts();
        }
    }

    return result;
}